

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evtsrc.c
# Opt level: O1

_Bool al_emit_user_event(ALLEGRO_EVENT_SOURCE *src,ALLEGRO_EVENT *event,
                        _func_void_ALLEGRO_USER_EVENT_ptr *dtor)

{
  long lVar1;
  ALLEGRO_USER_EVENT_DESCRIPTOR *pAVar2;
  ALLEGRO_EVENT_SOURCE_REAL *this;
  double dVar3;
  
  if (dtor == (_func_void_ALLEGRO_USER_EVENT_ptr *)0x0) {
    pAVar2 = (ALLEGRO_USER_EVENT_DESCRIPTOR *)0x0;
  }
  else {
    pAVar2 = (ALLEGRO_USER_EVENT_DESCRIPTOR *)
             al_malloc_with_context
                       (0x10,0xe3,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/evtsrc.c"
                        ,"al_emit_user_event");
    pAVar2->refcount = 0;
    pAVar2->dtor = dtor;
  }
  (event->user).__internal__descr = pAVar2;
  if ((char)src->__pad[0] == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)(src->__pad + 2));
  }
  lVar1 = *(long *)(src->__pad + 0x10);
  if (lVar1 != 0) {
    dVar3 = al_get_time();
    (event->any).timestamp = dVar3;
    _al_event_source_emit_event(src,event);
  }
  if ((char)src->__pad[0] == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)(src->__pad + 2));
  }
  if (dtor != (_func_void_ALLEGRO_USER_EVENT_ptr *)0x0 && lVar1 == 0) {
    (*dtor)((ALLEGRO_USER_EVENT *)event);
    al_free_with_context
              ((event->joystick).id,0xfe,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/evtsrc.c"
               ,"al_emit_user_event");
  }
  return lVar1 != 0;
}

Assistant:

bool al_emit_user_event(ALLEGRO_EVENT_SOURCE *src,
   ALLEGRO_EVENT *event, void (*dtor)(ALLEGRO_USER_EVENT *))
{
   size_t num_queues;
   bool rc;

   ASSERT(src);
   ASSERT(event);

   if (dtor) {
      ALLEGRO_USER_EVENT_DESCRIPTOR *descr = al_malloc(sizeof(*descr));
      descr->refcount = 0;
      descr->dtor = dtor;
      event->user.__internal__descr = descr;
   }
   else {
      event->user.__internal__descr = NULL;
   }

   _al_event_source_lock(src);
   {
      ALLEGRO_EVENT_SOURCE_REAL *rsrc = (ALLEGRO_EVENT_SOURCE_REAL *)src;

      num_queues = _al_vector_size(&rsrc->queues);
      if (num_queues > 0) {
         event->any.timestamp = al_get_time();
         _al_event_source_emit_event(src, event);
         rc = true;
      }
      else {
         rc = false;
      }
   }
   _al_event_source_unlock(src);

   if (dtor && !rc) {
      dtor(&event->user);
      al_free(event->user.__internal__descr);
   }

   return rc;
}